

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O3

int main(void)

{
  int iVar1;
  quota q;
  
  plan(3);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  test_basic();
  test_hard_lease();
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_leases_on_destroy");
  LOCK();
  UNLOCK();
  _ok(1,"quota_lease(&l, 100) == 100",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6c
      ,"line %d",0x6c);
  LOCK();
  UNLOCK();
  _ok(1,"quota_leased(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6e
      ,"line %d",0x6e);
  _ok(1,"quota_available(&l) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x6f
      ,"line %d",0x6f);
  _ok(1,"quota_used(&q) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x70
      ,"line %d",0x70);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_leases_on_destroy");
  check_plan();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(3);
	header();

	test_basic();
	test_hard_lease();
	test_leases_on_destroy();

	footer();
	return check_plan();
}